

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControlPrivate::dragEnterEvent
          (QWidgetTextControlPrivate *this,QEvent *e,QMimeData *mimeData)

{
  undefined8 uVar1;
  char cVar2;
  bool bVar3;
  long in_FS_OFFSET;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
    cVar2 = (**(code **)(**(long **)&this->field_0x8 + 0xa0))(*(long **)&this->field_0x8,mimeData);
    if (cVar2 != '\0') {
      QTextCursor::QTextCursor((QTextCursor *)&local_20);
      uVar1 = *(undefined8 *)&this->dndFeedbackCursor;
      *(undefined8 *)&this->dndFeedbackCursor = local_20;
      local_20 = uVar1;
      QTextCursor::~QTextCursor((QTextCursor *)&local_20);
      bVar3 = true;
      goto LAB_0047f732;
    }
  }
  e[0xc] = (QEvent)0x0;
  bVar3 = false;
LAB_0047f732:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::dragEnterEvent(QEvent *e, const QMimeData *mimeData)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData)) {
        e->ignore();
        return false;
    }

    dndFeedbackCursor = QTextCursor();

    return true; // accept proposed action
}